

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool __thiscall
Clasp::mt::SharedLitsClause::minimize
          (SharedLitsClause *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  bool bVar1;
  Literal LVar2;
  Literal *pLVar3;
  ConstraintScore *in_RSI;
  CCMinRecursive *in_RDI;
  Literal *end;
  Literal *r;
  ConstraintScore *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc8;
  Literal *local_28;
  
  ConstraintInfo::score((ConstraintInfo *)&in_RDI->open);
  Solver::updateOnMinimize
            ((Solver *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  local_28 = SharedLiterals::begin(*(SharedLiterals **)&(in_RDI->todo).ebo_.size);
  pLVar3 = SharedLiterals::end((SharedLiterals *)
                               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  while( true ) {
    if (local_28 == pLVar3) {
      return true;
    }
    bVar1 = Clasp::operator!=((Literal *)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              (Literal *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb7 = 0;
    if (bVar1) {
      in_stack_ffffffffffffffa8 = in_RSI;
      LVar2 = Literal::operator~((Literal *)in_RSI);
      bVar1 = Solver::ccMinimize((Solver *)CONCAT44(LVar2.rep_,in_stack_ffffffffffffffc8),
                                 (Literal)(uint32)((ulong)pLVar3 >> 0x20),in_RDI);
      in_stack_ffffffffffffffb7 = bVar1 ^ 0xff;
    }
    if ((in_stack_ffffffffffffffb7 & 1) != 0) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool SharedLitsClause::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	s.updateOnMinimize(info_.score());
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r != p && !s.ccMinimize(~*r, rec)) { return false; }
	}
	return true;
}